

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_expressionlistref.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundExpressionListRef *ref)

{
  undefined8 *puVar1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar2;
  pointer puVar3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  reference pvVar5;
  pointer pEVar6;
  pointer this_00;
  long in_RDX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *expr_list;
  undefined8 *puVar7;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  pointer this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr;
  vector<duckdb::LogicalType,_true> types;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_70;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_68;
  _Head_base<0UL,_duckdb::LogicalExpressionGet_*,_false> local_60;
  vector<duckdb::LogicalType,_true> local_58;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_40;
  long local_38;
  
  local_40._M_head_impl = (LogicalOperator *)this;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)GenerateTableIndex((Binder *)ref);
  make_uniq_base<duckdb::LogicalOperator,duckdb::LogicalDummyScan,unsigned_long>
            ((duckdb *)&local_70,(unsigned_long *)&local_58);
  puVar7 = *(undefined8 **)(in_RDX + 0x18);
  puVar1 = *(undefined8 **)(in_RDX + 0x20);
  local_38 = in_RDX;
  if (puVar7 != puVar1) {
    do {
      puVar2 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               puVar7[1];
      for (expr_ptr = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)*puVar7; expr_ptr != puVar2; expr_ptr = expr_ptr + 1) {
        PlanSubqueries((Binder *)ref,expr_ptr,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&local_70);
      }
      puVar7 = puVar7 + 3;
    } while (puVar7 != puVar1);
  }
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
           ::operator[]((vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
                         *)(local_38 + 0x18),0);
  this_01 = (pvVar5->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pvVar5->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != puVar3) {
    do {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58,
                 &pEVar6->return_type);
      this_01 = this_01 + 1;
    } while (this_01 != puVar3);
  }
  make_uniq<duckdb::LogicalExpressionGet,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,true>>
            ((duckdb *)&local_60,(unsigned_long *)(local_38 + 0x60),&local_58,
             (vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
              *)(local_38 + 0x18));
  this_00 = unique_ptr<duckdb::LogicalExpressionGet,_std::default_delete<duckdb::LogicalExpressionGet>,_true>
            ::operator->((unique_ptr<duckdb::LogicalExpressionGet,_std::default_delete<duckdb::LogicalExpressionGet>,_true>
                          *)&local_60);
  _Var4._M_head_impl = local_40._M_head_impl;
  local_68._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (LogicalOperator *)0x0;
  LogicalOperator::AddChild
            (&this_00->super_LogicalOperator,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_68);
  if (local_68._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_68._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_68._M_head_impl = (LogicalOperator *)0x0;
  (_Var4._M_head_impl)->_vptr_LogicalOperator = (_func_int **)local_60._M_head_impl;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58);
  if (local_70._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_70._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         _Var4._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundExpressionListRef &ref) {
	auto root = make_uniq_base<LogicalOperator, LogicalDummyScan>(GenerateTableIndex());
	// values list, first plan any subqueries in the list
	for (auto &expr_list : ref.values) {
		for (auto &expr : expr_list) {
			PlanSubqueries(expr, root);
		}
	}
	// now create a LogicalExpressionGet from the set of expressions
	// fetch the types
	vector<LogicalType> types;
	for (auto &expr : ref.values[0]) {
		types.push_back(expr->return_type);
	}
	auto expr_get = make_uniq<LogicalExpressionGet>(ref.bind_index, types, std::move(ref.values));
	expr_get->AddChild(std::move(root));
	return std::move(expr_get);
}